

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffirow(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  long lVar1;
  int iVar2;
  long lVar3;
  FITSfile *pFVar4;
  long lVar5;
  char *err_message;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  int tstatus;
  int local_34;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_0012787f;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar4 = fptr->Fptr;
  if (pFVar4->hdutype == 0) {
    ffpmsg("Can only add rows to TABLE or BINTABLE extension (ffirow)");
    *status = 0xeb;
    return 0xeb;
  }
  if (nrows < 0) {
    *status = 0x132;
    return 0x132;
  }
  if (nrows == 0) goto LAB_0012787f;
  lVar1 = pFVar4->numrows;
  if (lVar1 < firstrow) {
    err_message = "Insert position greater than the number of rows in the table (ffirow)";
LAB_001277ca:
    ffpmsg(err_message);
    *status = 0x133;
    return 0x133;
  }
  if (firstrow < 0) {
    err_message = "Insert position is less than 0 (ffirow)";
    goto LAB_001277ca;
  }
  lVar6 = pFVar4->rowlength;
  lVar7 = pFVar4->heapsize + pFVar4->heapstart;
  lVar3 = ((lVar7 + 0xb3f) / 0xb40) * -0xb40 + lVar7 + 0xb3f;
  lVar5 = lVar6 * nrows;
  if (0xb3f - lVar3 < lVar5) {
    ffiblk(fptr,(lVar3 + lVar5) / 0xb40,1,status);
    pFVar4 = fptr->Fptr;
LAB_001277e4:
    lVar6 = lVar6 * firstrow;
    ffshft(fptr,lVar6 + pFVar4->datastart,lVar7 - lVar6,lVar5,status);
    pFVar4 = fptr->Fptr;
  }
  else if (0 < lVar5) goto LAB_001277e4;
  lVar5 = lVar5 + pFVar4->heapstart;
  pFVar4->heapstart = lVar5;
  local_34 = 0;
  ffmkyj(fptr,"THEAP",lVar5,"&",&local_34);
  ffmkyj(fptr,"NAXIS2",lVar1 + nrows,"&",status);
  pFVar4 = fptr->Fptr;
  auVar8._8_4_ = (int)nrows;
  auVar8._0_8_ = nrows;
  auVar8._12_4_ = (int)((ulong)nrows >> 0x20);
  pFVar4->origrows = nrows + pFVar4->origrows;
  pFVar4->numrows = auVar8._8_8_ + pFVar4->numrows;
LAB_0012787f:
  return *status;
}

Assistant:

int ffirow(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstrow,   /* I - insert space AFTER this row              */
                            /*     0 = insert space at beginning of table   */
           LONGLONG nrows,      /* I - number of rows to insert                 */
           int *status)     /* IO - error status                            */
/*
 insert NROWS blank rows immediated after row firstrow (1 = first row).
 Set firstrow = 0 to insert space at the beginning of the table.
*/
{
    int tstatus;
    LONGLONG naxis1, naxis2;
    LONGLONG datasize, firstbyte, nshift, nbytes;
    LONGLONG freespace;
    long nblock;

    if (*status > 0)
        return(*status);

        /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
         /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only add rows to TABLE or BINTABLE extension (ffirow)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    /* get the current size of the table */
    /* use internal structure since NAXIS2 keyword may not be up to date */
    naxis1 = (fptr->Fptr)->rowlength;
    naxis2 = (fptr->Fptr)->numrows;

    if (firstrow > naxis2)
    {
        ffpmsg(
   "Insert position greater than the number of rows in the table (ffirow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow < 0)
    {
        ffpmsg("Insert position is less than 0 (ffirow)");
        return(*status = BAD_ROW_NUM);
    }

    /* current data size */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nshift = naxis1 * nrows;          /* no. of bytes to add to table */

    if ( (freespace - nshift) < 0)   /* not enough existing space? */
    {
        nblock = (long) ((nshift - freespace + 2879) / 2880);   /* number of blocks */
        ffiblk(fptr, nblock, 1, status);               /* insert the blocks */
    }

    firstbyte = naxis1 * firstrow;    /* relative insert position */
    nbytes = datasize - firstbyte;           /* no. of bytes to shift down */
    firstbyte += ((fptr->Fptr)->datastart);  /* absolute insert position */

    if (nshift > 0) {  /* nshift may be zero if naxis1 == naxis2 == 0 */
      ffshft(fptr, firstbyte, nbytes, nshift, status); /* shift rows and heap */
    }

    /* update the heap starting address */
    (fptr->Fptr)->heapstart += nshift;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

    /* update the NAXIS2 keyword */
    ffmkyj(fptr, "NAXIS2", naxis2 + nrows, "&", status);
    ((fptr->Fptr)->numrows) += nrows;
    ((fptr->Fptr)->origrows) += nrows;

    return(*status);
}